

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

void __thiscall QPDF::warn(QPDF *this,QPDFExc *e)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  pointer pQVar2;
  Pipeline *pPVar3;
  char *cstr;
  undefined8 extraout_RAX;
  undefined1 local_30 [32];
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (((_Var1._M_head_impl)->max_warnings != 0) &&
     ((_Var1._M_head_impl)->max_warnings <=
      (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->warnings + 8) -
              *(long *)&((_Var1._M_head_impl)->warnings).
                        super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_> >> 7))) {
    local_30._0_8_ = (element_type *)(local_30 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,"Too many warnings - file is too badly damaged","");
    stopOnError(this,(string *)local_30);
    if ((element_type *)local_30._0_8_ != (element_type *)(local_30 + 0x10)) {
      operator_delete((void *)local_30._0_8_,local_30._16_8_ + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::push_back
            (&((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->warnings,e);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->suppress_warnings == false) {
    QPDFLogger::getWarn((QPDFLogger *)local_30,SUB81(*(undefined8 *)&(_Var1._M_head_impl)->log,0));
    pPVar3 = Pipeline::operator<<((Pipeline *)local_30._0_8_,"WARNING: ");
    pQVar2 = *(pointer *)
              ((long)&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->warnings + 8);
    cstr = (char *)(**(code **)(*(long *)(pQVar2 + 0xffffffffffffffff) + 0x10))
                             (pQVar2 + 0xffffffffffffffff);
    pPVar3 = Pipeline::operator<<(pPVar3,cstr);
    Pipeline::operator<<(pPVar3,"\n");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
    }
  }
  return;
}

Assistant:

void
QPDF::warn(QPDFExc const& e)
{
    if (m->max_warnings > 0 && m->warnings.size() >= m->max_warnings) {
        stopOnError("Too many warnings - file is too badly damaged");
    }
    m->warnings.push_back(e);
    if (!m->suppress_warnings) {
        *m->log->getWarn() << "WARNING: " << m->warnings.back().what() << "\n";
    }
}